

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O1

String * __thiscall LiteScript::String::operator*=(String *this,uint nb)

{
  pointer pcVar1;
  u32string string;
  char32_t *local_38;
  size_type local_30;
  char32_t local_28 [4];
  
  pcVar1 = (this->str)._M_dataplus._M_p;
  local_38 = local_28;
  std::__cxx11::u32string::_M_construct<char32_t*>
            ((u32string *)&local_38,pcVar1,pcVar1 + (this->str)._M_string_length);
  (this->str)._M_string_length = 0;
  *(this->str)._M_dataplus._M_p = L'\0';
  if (nb != 0) {
    do {
      std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
      _M_append(&this->str,local_38,local_30);
      nb = nb - 1;
    } while (nb != 0);
  }
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  return this;
}

Assistant:

LiteScript::String& LiteScript::String::operator*=(unsigned int nb) {
    std::u32string string = this->str;
    this->str.clear();
    for (unsigned int i = 0; i < nb; i++)
        this->str += string;
    return *this;
}